

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian-branching.hxx
# Opt level: O3

void __thiscall
lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::setup
          (HungarianBranching<lineage::heuristics::PartitionGraph> *this)

{
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  iterator __position;
  size_t sVar1;
  PartitionGraph *this_01;
  value_type_conflict4 local_21;
  unsigned_long local_20;
  
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->partitions_,
           ((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_)->data_->
           problemGraph->numberOfFrames_);
  local_20 = 0;
  this_01 = (this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_;
  if ((this_01->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
      super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_01->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
      super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      sVar1 = PartitionGraph::frameOfPartition(this_01,local_20);
      this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                ((this->partitions_).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + sVar1);
      __position._M_current = *(unsigned_long **)(this_00 + 8);
      if (__position._M_current == *(unsigned_long **)(this_00 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_realloc_insert<unsigned_long&>
                  (this_00,__position,&local_20);
      }
      else {
        *__position._M_current = local_20;
        *(unsigned_long **)(this_00 + 8) = __position._M_current + 1;
      }
      local_20 = local_20 + 1;
      this_01 = (this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_;
    } while (local_20 <
             (ulong)((long)(this_01->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>)
                           .vertices_.
                           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this_01->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>)
                           .vertices_.
                           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  local_21 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->solution_,
             (long)(this_01->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                   super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this_01->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
                   super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,&local_21);
  return;
}

Assistant:

inline void
HungarianBranching<GRAPH>::setup()
{
    partitions_.resize(this->graph_.data_.problemGraph.numberOfFrames());
    for (size_t partitionIdx = 0;
         partitionIdx < this->graph_.numberOfVertices(); ++partitionIdx) {

        try {
            const auto& frame = this->graph_.frameOfPartition(partitionIdx);
            partitions_[frame].emplace_back(partitionIdx);
        } catch (std::runtime_error&) {
            continue; // empty partitions are ignored.
        }
    }

    // initialize solution
    solution_.resize(this->graph_.numberOfEdges(), 0);
}